

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O0

pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
generateRandomData<makeTests(TasGrid::TypeAcceleration,int)::__15>
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,TasmanianSparseGrid *grid,int param_3)

{
  pointer *this;
  int b;
  int a;
  size_t sVar1;
  reference x_00;
  reference y_00;
  int local_f0;
  allocator<double> local_e9;
  int i;
  vector<double,_std::allocator<double>_> y;
  function<double_()> local_c0;
  undefined1 local_a0 [8];
  vector<double,_std::allocator<double>_> x;
  uniform_real_distribution<double> unif;
  minstd_rand park_miller;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> transform_b;
  vector<double,_std::allocator<double>_> transform_a;
  int num_outputs;
  int num_dimensions;
  int num_samples_local;
  TasmanianSparseGrid *grid_local;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  *local_10;
  
  local_10 = __return_storage_ptr__;
  b = TasGrid::TasmanianSparseGrid::getNumDimensions(grid);
  a = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  this = &transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  TasGrid::TasmanianSparseGrid::getDomainTransform((vector *)grid,(vector *)this);
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             &unif._M_param._M_b,0x2a);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             &x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,0.0,1.0);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)&x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::function<double()>::
  function<generateRandomData<makeTests(TasGrid::TypeAcceleration,int)::__15>(TasGrid::TasmanianSparseGrid_const&,makeTests(TasGrid::TypeAcceleration,int)::__15,int)::_lambda()_1_,void>
            ((function<double()> *)&local_c0,
             (anon_class_16_2_b54b3e13 *)
             &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  TasDREAM::genUniformSamples
            ((vector<double,_std::allocator<double>_> *)local_a0,
             (vector<double,_std::allocator<double>_> *)
             &transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<double,_std::allocator<double>_> *)local_60,param_3,&local_c0);
  std::function<double_()>::~function(&local_c0);
  sVar1 = TasGrid::Utils::size_mult<int,int>(a,param_3);
  std::allocator<double>::allocator(&local_e9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,sVar1,&local_e9);
  std::allocator<double>::~allocator(&local_e9);
  for (local_f0 = 0; local_f0 < param_3; local_f0 = local_f0 + 1) {
    sVar1 = TasGrid::Utils::size_mult<int,int>(local_f0,b);
    x_00 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_a0,sVar1);
    sVar1 = TasGrid::Utils::size_mult<int,int>(local_f0,a);
    y_00 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)&i,sVar1);
    makeTests::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&grid_local + 7),x_00,y_00,0);
  }
  std::
  make_pair<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_a0,
             (vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &transform_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<double>, std::vector<double>> generateRandomData(TasmanianSparseGrid const &grid, CallableModel model, int num_samples){
    int num_dimensions = grid.getNumDimensions();
    int num_outputs = grid.getNumOutputs();

    std::vector<double> transform_a, transform_b;
    grid.getDomainTransform(transform_a, transform_b);

    std::minstd_rand park_miller(42);
    std::uniform_real_distribution<double> unif(0.0, 1.0);
    auto x = TasDREAM::genUniformSamples(transform_a, transform_b, num_samples, [&]()->double{ return unif(park_miller); });

    std::vector<double> y(Utils::size_mult(num_outputs, num_samples));

    for(int i=0; i<num_samples; i++)
        model(&x[Utils::size_mult(i, num_dimensions)], &y[Utils::size_mult(i, num_outputs)], 0);

    return std::make_pair(std::move(x), std::move(y));
}